

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * tcu::Format::operator<<
                    (ostream *str,
                    Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> *fmt)

{
  Hex<2UL> hex;
  byte *pbVar1;
  
  std::operator<<(str,"{ ");
  for (pbVar1 = (fmt->begin).m_iter; pbVar1 != (fmt->end).m_iter; pbVar1 = pbVar1 + 1) {
    if (pbVar1 != (fmt->begin).m_iter) {
      std::operator<<(str,", ");
    }
    hex.value._1_7_ = 0;
    hex.value._0_1_ = *pbVar1;
    operator<<(str,hex);
  }
  std::operator<<(str," }");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}